

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.hpp
# Opt level: O1

void libtorrent::aux::
     sorted_insert<libtorrent::aux::peer_connection*,libtorrent::aux::bt_peer_connection*>
               (vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                *container,bt_peer_connection *v)

{
  const_iterator cVar1;
  const_iterator __position;
  ulong uVar2;
  ulong uVar3;
  bt_peer_connection *local_8;
  
  cVar1._M_current =
       (container->
       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(container->
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)cVar1._M_current >> 3;
  while (__position._M_current = cVar1._M_current, 0 < (long)uVar3) {
    uVar2 = uVar3 >> 1;
    uVar3 = ~uVar2 + uVar3;
    cVar1._M_current = __position._M_current + uVar2 + 1;
    if (v <= (bt_peer_connection *)__position._M_current[uVar2]) {
      cVar1._M_current = __position._M_current;
      uVar3 = uVar2;
    }
  }
  local_8 = v;
  ::std::
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>::
  _M_insert_rval(container,__position,(value_type *)&local_8);
  return;
}

Assistant:

void sorted_insert(std::vector<T>& container, U v)
	{
		auto i = std::lower_bound(container.begin(), container.end(), v);
		container.insert(i, v);
	}